

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printAbsBranchOperand(MCInst *MI,uint OpNo,SStream *O)

{
  cs_struct *h;
  cs_detail *pcVar1;
  _Bool _Var2;
  uint id;
  MCOperand *pMVar3;
  int64_t iVar4;
  uint8_t *puVar5;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  MCInst *unaff_retaddr;
  int64_t imm;
  long local_20;
  undefined4 in_stack_fffffffffffffff0;
  
  pMVar3 = MCInst_getOperand(in_RDI,in_ESI);
  _Var2 = MCOperand_isImm(pMVar3);
  if (_Var2) {
    pMVar3 = MCInst_getOperand(in_RDI,in_ESI);
    iVar4 = MCOperand_getImm(pMVar3);
    local_20 = iVar4 * 4;
    h = in_RDI->csh;
    id = MCInst_getOpcode(in_RDI);
    _Var2 = PPC_abs_branch(h,id);
    if (!_Var2) {
      local_20 = in_RDI->address + local_20;
    }
    SStream_concat(in_RDX,"0x%lx",local_20);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar5 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.addr_size * 0x18 + 0x1d;
      puVar5[0] = '\x02';
      puVar5[1] = '\0';
      puVar5[2] = '\0';
      puVar5[3] = '\0';
      *(long *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.addr_size * 0x18 + 0x25) = local_20;
      pcVar1 = in_RDI->flat_insn->detail;
      (pcVar1->field_6).x86.addr_size = (pcVar1->field_6).x86.addr_size + '\x01';
    }
  }
  else {
    printOperand(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),
                 (SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

static void printAbsBranchOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	int64_t imm;

	if (!MCOperand_isImm(MCInst_getOperand(MI, OpNo))) {
		printOperand(MI, OpNo, O);
		return;
	}

	imm = MCOperand_getImm(MCInst_getOperand(MI, OpNo)) * 4;

	if (!PPC_abs_branch(MI->csh, MCInst_getOpcode(MI))) {
		imm = MI->address + imm;
	}

	SStream_concat(O, "0x%"PRIx64, imm);

	if (MI->csh->detail) {
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = imm;
		MI->flat_insn->detail->ppc.op_count++;
	}
}